

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_round(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 nLen_00;
  char local_138 [4];
  sxu32 nLen;
  char zBuf [256];
  double r;
  int n;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  r._4_4_ = 0;
  if (nArg < 1) {
    jx9_result_int(pCtx,0);
  }
  else {
    if (1 < nArg) {
      r._4_4_ = jx9_value_to_int(apArg[1]);
      if (0x1e < (int)r._4_4_) {
        r._4_4_ = 0x1e;
      }
      if ((int)r._4_4_ < 0) {
        r._4_4_ = 0;
      }
    }
    zBuf._248_8_ = jx9_value_to_double(*apArg);
    if (((r._4_4_ != 0) || ((double)zBuf._248_8_ < 0.0)) ||
       (9.223372036854776e+18 <= (double)zBuf._248_8_)) {
      if (((r._4_4_ != 0) || (0.0 <= (double)zBuf._248_8_)) ||
         (9.223372036854776e+18 <= -(double)zBuf._248_8_)) {
        nLen_00 = SyBufferFormat(local_138,0x100,"%.*f",zBuf._248_8_,(ulong)r._4_4_);
        SyStrToReal(local_138,nLen_00,zBuf + 0xf8,(char **)0x0);
      }
      else {
        zBuf._248_8_ = -(double)(long)(-(double)zBuf._248_8_ + 0.5);
      }
    }
    else {
      zBuf._248_8_ = (undefined8)(long)((double)zBuf._248_8_ + 0.5);
    }
    jx9_result_double(pCtx,(double)zBuf._248_8_);
  }
  return 0;
}

Assistant:

static int jx9Builtin_round(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int n = 0;
	double r;
	if( nArg < 1 ){
		/* Missing argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the precision if available */
	if( nArg > 1 ){
		n = jx9_value_to_int(apArg[1]);
		if( n>30 ){
			n = 30;
		}
		if( n<0 ){
			n = 0;
		}
	}
	r = jx9_value_to_double(apArg[0]);
	/* If Y==0 and X will fit in a 64-bit int, 
     * handle the rounding directly.Otherwise 
	 * use our own cutsom printf [i.e:SyBufferFormat()].
     */
  if( n==0 && r>=0 && r<LARGEST_INT64-1 ){
    r = (double)((jx9_int64)(r+0.5));
  }else if( n==0 && r<0 && (-r)<LARGEST_INT64-1 ){
    r = -(double)((jx9_int64)((-r)+0.5));
  }else{
	  char zBuf[256];
	  sxu32 nLen;
	  nLen = SyBufferFormat(zBuf, sizeof(zBuf), "%.*f", n, r);
	  /* Convert the string to real number */
	  SyStrToReal(zBuf, nLen, (void *)&r, 0);
  }
  /* Return thr rounded value */
  jx9_result_double(pCtx, r);
  return JX9_OK;
}